

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O2

void parse_preproc_line_line(Source_File *src,Translation_Data *translation_data)

{
  char cVar1;
  Queue *tokens;
  token *token;
  unsigned_long_long uVar2;
  void *__ptr;
  Source_Name *pSVar3;
  char *error_message;
  Translation_Data hack;
  
  tokens = lex_line(src,translation_data,'\0');
  hack.errors = translation_data->errors;
  hack.number_of_errors_when_last_checked = translation_data->number_of_errors_when_last_checked;
  hack.source_files = translation_data->source_files;
  hack.macros = translation_data->macros;
  hack.types = translation_data->types;
  hack.external_linkage = translation_data->external_linkage;
  hack.internal_linkage = translation_data->internal_linkage;
  hack.tokens = tokens;
  cVar1 = check(&hack,KW_DECIMAL_CONSTANT,0);
  if (cVar1 == '\0') {
    flush_tokens(tokens);
    error_message = "expected a line number in #line preprocessing directive here";
  }
  else {
    token = (token *)Queue_Pop(tokens);
    uVar2 = evaluate_integer_constant(token,translation_data);
    src->which_row = uVar2;
    cVar1 = check(&hack,KW_STRING,0);
    if (cVar1 == '\0') {
      if (tokens->size == 0) {
        return;
      }
      free(token);
      flush_tokens(tokens);
      error_message = "expected a string or new line in #line preprocessing directive here";
    }
    else {
      __ptr = Queue_Pop(tokens);
      *(undefined1 *)(*(long *)((long)__ptr + 0x10) + *(long *)((long)__ptr + 8)) = 0;
      if (tokens->size == 0) {
        delete_source_name(src->src_name);
        pSVar3 = get_source_name(*(char **)((long)__ptr + 0x10),"");
        src->src_name = pSVar3;
        return;
      }
      free(token);
      free(__ptr);
      flush_tokens(tokens);
      error_message = "expected a new line in #line preprocessing directive here";
    }
  }
  push_lexing_error(error_message,src,translation_data);
  return;
}

Assistant:

void parse_preproc_line_line(struct Source_File *src,struct Translation_Data *translation_data)
{
	struct Queue *tokens;
	struct Translation_Data hack;
	struct token *hold_line;
	struct token *hold_name;

	tokens=lex_line(src,translation_data,0);
	hack=*translation_data;
	hack.tokens=tokens;
	/*TODO account for other types of integer constants*/
	if(check(&hack,KW_DECIMAL_CONSTANT,0))
	{
		hold_line=(struct token*)Queue_Pop(tokens);
		src->which_row=evaluate_integer_constant(hold_line,translation_data);
		if(check(&hack,KW_STRING,0))
		{
			hold_name=(struct token*)Queue_Pop(tokens);
			hold_name->data[hold_name->data_size]='\0';
			if(tokens->size>0)
			{
				free(hold_line);
				free(hold_name);
				flush_tokens(tokens);
				push_lexing_error("expected a new line in #line preprocessing directive here",src,translation_data);
				return;
			}else
			{
				delete_source_name(src->src_name);
				src->src_name=get_source_name(hold_name->data,"");
				return;
			}

		}else if(tokens->size>0)
		{
			free(hold_line);
			flush_tokens(tokens);
			push_lexing_error("expected a string or new line in #line preprocessing directive here",src,translation_data);
			return;
		}

	}else
	{
		flush_tokens(tokens);
		push_lexing_error("expected a line number in #line preprocessing directive here",src,translation_data);
		return;
	}
}